

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_generate_luts.c
# Opt level: O0

int t1_init_spb(int f)

{
  OPJ_INT32 OVar1;
  OPJ_INT32 OVar2;
  OPJ_INT32 OVar3;
  OPJ_INT32 OVar4;
  bool local_22;
  bool local_21;
  uint local_18;
  int n;
  int vc;
  int hc;
  int f_local;
  
  OVar1 = opj_int_min((uint)((f & 0x220U) == 0x20) + (uint)((f & 0x880U) == 0x80),1);
  OVar2 = opj_int_min((uint)((f & 0x220U) == 0x220) + (uint)((f & 0x880U) == 0x880),1);
  OVar3 = opj_int_min((uint)((f & 0x110U) == 0x10) + (uint)((f & 0x440U) == 0x40),1);
  OVar4 = opj_int_min((uint)((f & 0x110U) == 0x110) + (uint)((f & 0x440U) == 0x440),1);
  if ((OVar1 == OVar2) && (OVar3 == OVar4)) {
    local_18 = 0;
  }
  else {
    local_21 = true;
    if (OVar1 - OVar2 < 1) {
      local_22 = OVar1 == OVar2 && 0 < OVar3 - OVar4;
      local_21 = local_22;
    }
    local_18 = (uint)((local_21 ^ 0xffU) & 1);
  }
  return local_18;
}

Assistant:

static int t1_init_spb(int f) {
	int hc, vc, n;

	hc = opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
				T1_SIG_E) + ((f & (T1_SIG_W | T1_SGN_W)) == T1_SIG_W),
			1) - opj_int_min(((f & (T1_SIG_E | T1_SGN_E)) ==
					(T1_SIG_E | T1_SGN_E)) +
				((f & (T1_SIG_W | T1_SGN_W)) ==
				 (T1_SIG_W | T1_SGN_W)), 1);

	vc = opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
				T1_SIG_N) + ((f & (T1_SIG_S | T1_SGN_S)) == T1_SIG_S),
			1) - opj_int_min(((f & (T1_SIG_N | T1_SGN_N)) ==
					(T1_SIG_N | T1_SGN_N)) +
				((f & (T1_SIG_S | T1_SGN_S)) ==
				 (T1_SIG_S | T1_SGN_S)), 1);

	if (!hc && !vc)
		n = 0;
	else
		n = (!(hc > 0 || (!hc && vc > 0)));

	return n;
}